

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

bool __thiscall
QMetaMethod::invokeOnGadget
          (QMetaMethod *this,void *gadget,QGenericReturnArgument returnValue,QGenericArgument val0,
          QGenericArgument val1,QGenericArgument val2,QGenericArgument val3,QGenericArgument val4,
          QGenericArgument val5,QGenericArgument val6,QGenericArgument val7,QGenericArgument val8,
          QGenericArgument val9)

{
  StaticMetacallFunction p_Var1;
  QByteArrayView typeName;
  int iVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  QObject *in_RSI;
  QMetaMethod *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  StaticMetaCallFunction callFunction;
  int idx_relative;
  int paramCount;
  int t;
  char *retType;
  QByteArray normalized;
  void *param [11];
  char *typeNames [11];
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  QMetaMethod *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int local_158;
  byte local_121;
  QGenericArgument local_e8 [16];
  QGenericArgument local_d8 [16];
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI == (QObject *)0x0) || (in_RDI->mobj == (QMetaObject *)0x0)) {
    local_121 = 0;
    goto LAB_0036442c;
  }
  pvVar4 = QGenericArgument::data(local_d8);
  if (pvVar4 != (void *)0x0) {
    QMetaMethod::typeName
              ((QMetaMethod *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QGenericArgument::name(local_d8);
    iVar2 = qstrcmp((char *)in_stack_fffffffffffffe10,
                    (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    if (iVar2 != 0) {
      QGenericArgument::name(local_d8);
      QMetaObject::normalizedType(in_stack_fffffffffffffe28);
      QByteArray::constData((QByteArray *)0x364029);
      iVar2 = qstrcmp((char *)in_stack_fffffffffffffe10,
                      (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      if (iVar2 == 0) {
LAB_00364134:
        bVar6 = false;
      }
      else {
        iVar2 = returnType(in_stack_fffffffffffffe10);
        bVar6 = true;
        if (iVar2 != 0) {
          QByteArrayView::QByteArrayView<QByteArray,_true>
                    ((QByteArrayView *)CONCAT44(iVar2,in_stack_fffffffffffffe20),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          typeName.m_size._4_4_ = in_stack_fffffffffffffe1c;
          typeName.m_size._0_4_ = in_stack_fffffffffffffe18;
          typeName.m_data._0_4_ = in_stack_fffffffffffffe20;
          typeName.m_data._4_4_ = iVar2;
          QMetaType::fromName(typeName);
          iVar3 = QMetaType::id((QMetaType *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          bVar6 = iVar2 != iVar3;
        }
        if (!bVar6) goto LAB_00364134;
        local_121 = 0;
        bVar6 = true;
      }
      QByteArray::~QByteArray((QByteArray *)0x36414c);
      if (bVar6) goto LAB_0036442c;
    }
  }
  memset(&local_68,0xaa,0x58);
  local_68 = QGenericArgument::name(local_d8);
  local_60 = QGenericArgument::name(local_e8);
  local_58 = QGenericArgument::name((QGenericArgument *)&stack0x00000008);
  local_50 = QGenericArgument::name((QGenericArgument *)&stack0x00000018);
  local_48 = QGenericArgument::name((QGenericArgument *)&stack0x00000028);
  local_40 = QGenericArgument::name((QGenericArgument *)&stack0x00000038);
  local_38 = QGenericArgument::name((QGenericArgument *)&stack0x00000048);
  local_30 = QGenericArgument::name((QGenericArgument *)&stack0x00000058);
  local_28 = QGenericArgument::name((QGenericArgument *)&stack0x00000068);
  local_20 = QGenericArgument::name((QGenericArgument *)&stack0x00000078);
  local_18 = QGenericArgument::name((QGenericArgument *)&stack0x00000088);
  local_158 = 1;
  while ((local_158 < 0xb && (sVar5 = qstrlen((char *)in_stack_fffffffffffffe10), sVar5 != 0))) {
    local_158 = local_158 + 1;
  }
  anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::get(in_RDI);
  iVar2 = anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::parameterCount
                    ((QMetaMethodPrivate *)0x3642ba);
  if (iVar2 < local_158) {
    memset(&local_c8,0xaa,0x58);
    local_c8 = QGenericArgument::data(local_d8);
    local_c0 = QGenericArgument::data(local_e8);
    local_b8 = QGenericArgument::data((QGenericArgument *)&stack0x00000008);
    local_b0 = QGenericArgument::data((QGenericArgument *)&stack0x00000018);
    local_a8 = QGenericArgument::data((QGenericArgument *)&stack0x00000028);
    local_a0 = QGenericArgument::data((QGenericArgument *)&stack0x00000038);
    local_98 = QGenericArgument::data((QGenericArgument *)&stack0x00000048);
    local_90 = QGenericArgument::data((QGenericArgument *)&stack0x00000058);
    local_88 = QGenericArgument::data((QGenericArgument *)&stack0x00000068);
    local_80 = QGenericArgument::data((QGenericArgument *)&stack0x00000078);
    local_78 = QGenericArgument::data((QGenericArgument *)&stack0x00000088);
    anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::get(in_RDI);
    iVar2 = anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::ownMethodIndex
                      ((QMetaMethodPrivate *)in_stack_fffffffffffffe10);
    p_Var1 = (in_RDI->mobj->d).static_metacall;
    if (p_Var1 == (StaticMetacallFunction)0x0) {
      local_121 = 0;
    }
    else {
      (*p_Var1)(in_RSI,InvokeMetaMethod,iVar2,&local_c8);
      local_121 = 1;
    }
  }
  else {
    local_121 = 0;
  }
LAB_0036442c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_121 & 1);
}

Assistant:

bool QMetaMethod::invokeOnGadget(void *gadget,
                                 QGenericReturnArgument returnValue,
                                 QGenericArgument val0,
                                 QGenericArgument val1,
                                 QGenericArgument val2,
                                 QGenericArgument val3,
                                 QGenericArgument val4,
                                 QGenericArgument val5,
                                 QGenericArgument val6,
                                 QGenericArgument val7,
                                 QGenericArgument val8,
                                 QGenericArgument val9) const
{
   if (!gadget || !mobj)
        return false;

    // check return type
    if (returnValue.data()) {
        const char *retType = typeName();
        if (qstrcmp(returnValue.name(), retType) != 0) {
            // normalize the return value as well
            QByteArray normalized = QMetaObject::normalizedType(returnValue.name());
            if (qstrcmp(normalized.constData(), retType) != 0) {
                // String comparison failed, try compare the metatype.
                int t = returnType();
                if (t == QMetaType::UnknownType || t != QMetaType::fromName(normalized).id())
                    return false;
            }
        }
    }

    // check argument count (we don't allow invoking a method if given too few arguments)
    const char *typeNames[] = {
        returnValue.name(),
        val0.name(),
        val1.name(),
        val2.name(),
        val3.name(),
        val4.name(),
        val5.name(),
        val6.name(),
        val7.name(),
        val8.name(),
        val9.name()
    };
    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    if (paramCount <= QMetaMethodPrivate::get(this)->parameterCount())
        return false;

    // invoke!
    void *param[] = {
        returnValue.data(),
        val0.data(),
        val1.data(),
        val2.data(),
        val3.data(),
        val4.data(),
        val5.data(),
        val6.data(),
        val7.data(),
        val8.data(),
        val9.data()
    };
    int idx_relative = QMetaMethodPrivate::get(this)->ownMethodIndex();
    Q_ASSERT(QMetaObjectPrivate::get(mobj)->revision >= 6);
    QObjectPrivate::StaticMetaCallFunction callFunction = mobj->d.static_metacall;
    if (!callFunction)
        return false;
    callFunction(reinterpret_cast<QObject*>(gadget), QMetaObject::InvokeMetaMethod, idx_relative, param);
    return true;
}